

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialInterfacesManager.cpp
# Opt level: O2

string * __thiscall
helics::PotentialInterfacesManager::generateQueryResponse_abi_cxx11_
          (string *__return_storage_ptr__,PotentialInterfacesManager *this,string_view query)

{
  _Rb_tree_node_base *__str;
  value_t vVar1;
  json_value jVar2;
  bool bVar3;
  reference pvVar4;
  _Rb_tree_node_base *p_Var5;
  key_type *this_00;
  _Base_ptr p_Var6;
  initializer_list_t init;
  initializer_list_t init_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  json interfaces;
  data local_120;
  data local_110;
  string *local_100;
  _Rb_tree_node_base *local_f8;
  string templateKey;
  key_type local_d0;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  __y._M_str = "potential_interfaces";
  __y._M_len = 0x14;
  bVar3 = std::operator==(query,__y);
  if ((bVar3) && (((this->respondedToCommand)._M_base._M_i & 1U) == 0)) {
    local_100 = __return_storage_ptr__;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json(&interfaces,(nullptr_t)0x0);
    local_f8 = (_Rb_tree_node_base *)&(this->potInterfaces)._M_t._M_impl.super__Rb_tree_header;
    for (p_Var5 = (_Rb_tree_node_base *)
                  (this->potInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var5 != local_f8; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      init._M_len = 0;
      init._M_array = (iterator)&local_110;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init);
      __str = p_Var5 + 1;
      std::__cxx11::string::string
                ((string *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](&interfaces,&local_50);
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_110.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_110.m_value;
      local_110.m_type = vVar1;
      local_110.m_value = jVar2;
      std::__cxx11::string::~string((string *)&local_50);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_110);
      p_Var6 = (_Base_ptr)&p_Var5[2]._M_left;
      while (p_Var6 = *(_Base_ptr *)p_Var6, p_Var6 != (_Base_ptr)0x0) {
        if (this->hasPotentialTargetting == true) {
          std::__cxx11::string::string
                    ((string *)&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
          pvVar4 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](&interfaces,&local_d0);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar4,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&p_Var6[1]._M_parent);
          this_00 = &local_d0;
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
          pvVar4 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   ::operator[](&interfaces,&local_70);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&templateKey,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var6->_M_parent);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar4,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&templateKey);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)&templateKey);
          this_00 = &local_70;
        }
        std::__cxx11::string::~string((string *)this_00);
      }
    }
    for (p_Var5 = (_Rb_tree_node_base *)
                  (this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ; __return_storage_ptr__ = local_100,
        (_Rb_tree_header *)p_Var5 !=
        &(this->potInterfaceTemplates)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      std::__cxx11::string::string
                ((string *)&templateKey,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var5 + 1));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&templateKey);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&templateKey,
                 "_templates");
      init_00._M_len = 0;
      init_00._M_array = (iterator)&local_120;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::array(init_00);
      std::__cxx11::string::string
                ((string *)&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&templateKey);
      pvVar4 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](&interfaces,&local_90);
      vVar1 = (pvVar4->m_data).m_type;
      (pvVar4->m_data).m_type = local_120.m_type;
      jVar2 = (pvVar4->m_data).m_value;
      (pvVar4->m_data).m_value = local_120.m_value;
      local_120.m_type = vVar1;
      local_120.m_value = jVar2;
      std::__cxx11::string::~string((string *)&local_90);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_120);
      p_Var6 = (_Base_ptr)&p_Var5[2]._M_left;
      while (p_Var6 = *(_Base_ptr *)p_Var6, p_Var6 != (_Base_ptr)0x0) {
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&templateKey
                  );
        pvVar4 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 ::operator[](&interfaces,&local_b0);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::push_back(pvVar4,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            *)&p_Var6[1]._M_parent);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      std::__cxx11::string::~string((string *)&templateKey);
    }
    fileops::generateJsonString(local_100,&interfaces,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::data::~data(&interfaces.m_data);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PotentialInterfacesManager::generateQueryResponse(std::string_view query)
{
    if (query == "potential_interfaces") {
        if (respondedToCommand.load()) {
            // we have already generated interfaces so no need to respond to the query
            return std::string{};
        }
        nlohmann::json interfaces;
        for (const auto& iType : potInterfaces) {
            interfaces[iType.first] = nlohmann::json::array();
            for (const auto& ispec : iType.second) {
                if (hasPotentialTargetting) {
                    interfaces[iType.first].push_back(ispec.second);
                } else {
                    interfaces[iType.first].push_back(ispec.first);
                }
            }
        }
        for (const auto& iType : potInterfaceTemplates) {
            std::string templateKey = iType.first;
            templateKey.pop_back();
            templateKey += "_templates";
            interfaces[templateKey] = nlohmann::json::array();
            for (const auto& ispec : iType.second) {
                interfaces[templateKey].push_back(ispec.second);
            }
        }
        return fileops::generateJsonString(interfaces);
    }
    return std::string{};
}